

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComponentManager.cpp
# Opt level: O0

ErrorCode __thiscall ComponentManager::RemoveModule(ComponentManager *this,char *name)

{
  ModuleInfo *pMVar1;
  ModuleInfo *info;
  char *name_local;
  ComponentManager *this_local;
  
  pMVar1 = getModInfo(this,name);
  if ((pMVar1 == (ModuleInfo *)0x0) || (pMVar1->mModule == (IModule *)0x0)) {
    this_local._4_4_ = kNoClass;
  }
  else {
    (**(code **)(*(long *)pMVar1->mModule + 0x38))();
    (**(code **)(*(long *)pMVar1->mModule + 8))();
    pMVar1->mModule = (IModule *)0x0;
    this_local._4_4_ = kNoError;
  }
  return this_local._4_4_;
}

Assistant:

ErrorCode ComponentManager::RemoveModule( const char *name )
{
	ModuleInfo *info = getModInfo( name );

	if ( info == NULL || info->mModule == NULL )
		return kNoClass;	

	info->mModule->unloadComponents();
	info->mModule->Release();
	info->mModule = NULL;
	
	return kNoError;
}